

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

int av1_get_q_index_from_qstep_ratio(int leaf_qindex,double qstep_ratio,aom_bit_depth_t bit_depth)

{
  int16_t iVar1;
  int16_t iVar2;
  
  iVar1 = av1_dc_quant_QTX(leaf_qindex,0,bit_depth);
  if (1.0 <= qstep_ratio) {
    for (; leaf_qindex < 0x100; leaf_qindex = leaf_qindex + 1) {
      iVar2 = av1_dc_quant_QTX(leaf_qindex,0,bit_depth);
      if ((double)(int)iVar1 * qstep_ratio <= (double)(int)iVar2) {
        return leaf_qindex;
      }
    }
  }
  else {
    for (; 0 < leaf_qindex; leaf_qindex = leaf_qindex + -1) {
      iVar2 = av1_dc_quant_QTX(leaf_qindex,0,bit_depth);
      if ((double)(int)iVar2 <= (double)(int)iVar1 * qstep_ratio) {
        return leaf_qindex;
      }
    }
  }
  return leaf_qindex;
}

Assistant:

int av1_get_q_index_from_qstep_ratio(int leaf_qindex, double qstep_ratio,
                                     aom_bit_depth_t bit_depth) {
  const double leaf_qstep = av1_dc_quant_QTX(leaf_qindex, 0, bit_depth);
  const double target_qstep = leaf_qstep * qstep_ratio;
  int qindex = leaf_qindex;
  if (qstep_ratio < 1.0) {
    for (qindex = leaf_qindex; qindex > 0; --qindex) {
      const double qstep = av1_dc_quant_QTX(qindex, 0, bit_depth);
      if (qstep <= target_qstep) break;
    }
  } else {
    for (qindex = leaf_qindex; qindex <= MAXQ; ++qindex) {
      const double qstep = av1_dc_quant_QTX(qindex, 0, bit_depth);
      if (qstep >= target_qstep) break;
    }
  }
  return qindex;
}